

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>
::_insert<std::initializer_list<unsigned_int>>
          (Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>
           *this,initializer_list<unsigned_int> *column,Index columnIndex,Dimension dim)

{
  iterator iVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  uint uVar4;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (this[0x30] ==
      (Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>
       )0x1) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>
    ::_orderRows((Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>
                  *)this);
  }
  if (column->_M_len == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = column->_M_array[column->_M_len - 1];
  }
  uVar3 = (ulong)(*(long *)(this + 8) - *(long *)this) >> 2;
  if ((uint)uVar3 <= uVar4) {
    local_38 = CONCAT44(dim,(uint)uVar3);
    do {
      iVar1._M_current = *(uint **)(this + 8);
      if (iVar1._M_current == *(uint **)(this + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar1,(uint *)&local_38
                  );
      }
      else {
        *iVar1._M_current = (uint)uVar3;
        *(uint **)(this + 8) = iVar1._M_current + 1;
      }
      iVar1._M_current = *(uint **)(this + 0x20);
      if (iVar1._M_current == *(uint **)(this + 0x28)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)(this + 0x18),iVar1,
                   (uint *)&local_38);
      }
      else {
        *iVar1._M_current = (uint)local_38;
        *(uint **)(this + 0x20) = iVar1._M_current + 1;
      }
      uVar2 = (uint)local_38 + 1;
      uVar3 = (ulong)uVar2;
      local_38 = CONCAT44(local_38._4_4_,uVar2);
      dim = local_38._4_4_;
    } while (uVar2 <= uVar4);
  }
  uVar3 = (*(long *)(this + 0x40) - *(long *)(this + 0x38) >> 3) * -0x3333333333333333;
  if (uVar3 < columnIndex || uVar3 - columnIndex == 0) {
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>_>
    ::resize((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>_>
              *)(this + 0x38),(ulong)(columnIndex + 1));
  }
  _container_insert<std::initializer_list<unsigned_int>>(this,column,columnIndex,dim);
  return;
}

Assistant:

inline void Base_matrix<Master_matrix>::_insert(const Container& column, Index columnIndex, Dimension dim)
{
  _orderRowsIfNecessary();

  //resize of containers when necessary:
  Index pivot = 0;
  if (column.begin() != column.end()) {
    //first, compute pivot of `column`
    if constexpr (Master_matrix::Option_list::is_z2) {
      pivot = *std::prev(column.end());
    } else {
      pivot = std::prev(column.end())->first;
    }
    //row container
    if constexpr (Master_matrix::Option_list::has_row_access && !Master_matrix::Option_list::has_removable_rows)
      if (RA_opt::rows_->size() <= pivot) RA_opt::rows_->resize(pivot + 1);
  }

  //row swap map containers
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_column_and_row_swaps || Master_matrix::Option_list::has_vine_update) {
      for (auto id : column) {
        Index idx;
        if constexpr (Master_matrix::Option_list::is_z2) {
          idx = id;
        } else {
          idx = id.first;
        }
        Swap_opt::indexToRow_[idx] = idx;
        Swap_opt::rowToIndex_[idx] = idx;
      }
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_column_and_row_swaps || Master_matrix::Option_list::has_vine_update) {
      Index size = Swap_opt::indexToRow_.size();
      if (size <= pivot) {
        for (Index i = size; i <= pivot; i++) {
          Swap_opt::indexToRow_.push_back(i);
          Swap_opt::rowToIndex_.push_back(i);
        }
      }
    }
    //column container
    if constexpr (!Master_matrix::Option_list::has_row_access) {
      if (matrix_.size() <= columnIndex) {
        matrix_.resize(columnIndex + 1);
      }
    }
  }

  _container_insert(column, columnIndex, dim);
}